

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_text_yuv420sp
               (uchar *yuv420sp,int w,int h,char *text,int x,int y,int fontpixelsize,uint color)

{
  int fontpixelsize_00;
  
  draw_text_c1(yuv420sp,w,h,text,x,y,fontpixelsize,color & 0xff);
  fontpixelsize_00 = 1;
  if (1 < fontpixelsize / 2) {
    fontpixelsize_00 = fontpixelsize / 2;
  }
  draw_text_c2(yuv420sp + h * w,w / 2,h / 2,text,x / 2,y / 2,fontpixelsize_00,color >> 8 & 0xffff);
  return;
}

Assistant:

void draw_text_yuv420sp(unsigned char* yuv420sp, int w, int h, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    // assert w % 2 == 0
    // assert h % 2 == 0
    // assert x % 2 == 0
    // assert y % 2 == 0
    // assert fontpixelsize % 2 == 0

    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned int v_y;
    unsigned int v_uv;
    unsigned char* pen_color_y = (unsigned char*)&v_y;
    unsigned char* pen_color_uv = (unsigned char*)&v_uv;
    pen_color_y[0] = pen_color[0];
    pen_color_uv[0] = pen_color[1];
    pen_color_uv[1] = pen_color[2];

    unsigned char* Y = yuv420sp;
    draw_text_c1(Y, w, h, text, x, y, fontpixelsize, v_y);

    unsigned char* UV = yuv420sp + w * h;
    draw_text_c2(UV, w / 2, h / 2, text, x / 2, y / 2, std::max(fontpixelsize / 2, 1), v_uv);
}